

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_messages_proto2.upb.h
# Opt level: O2

bool protobuf_test_messages_proto2_TestAllTypesProto2_optional_bool
               (protobuf_test_messages_proto2_TestAllTypesProto2 *msg)

{
  bool bVar1;
  bool ret;
  bool default_val;
  upb_MiniTableField field;
  undefined1 local_28 [8];
  undefined1 local_20 [8];
  upb_MiniTableField local_18;
  
  local_20[0] = 0;
  local_18.number_dont_copy_me__upb_internal_use_only = 0xd;
  local_18.offset_dont_copy_me__upb_internal_use_only = 0x10;
  local_18.presence = 0x4c;
  local_18.submsg_index_dont_copy_me__upb_internal_use_only = 0xffff;
  local_18.descriptortype_dont_copy_me__upb_internal_use_only = '\b';
  local_18.mode_dont_copy_me__upb_internal_use_only = '\x02';
  bVar1 = _upb_MiniTableField_DataIsZero_dont_copy_me__upb_internal_use_only(&local_18,local_20);
  if ((!bVar1) &&
     (bVar1 = upb_Message_HasBaseField(&msg->base_dont_copy_me__upb_internal_use_only,&local_18),
     !bVar1)) {
    return (bool)local_20[0];
  }
  _upb_MiniTableField_DataCopy_dont_copy_me__upb_internal_use_only
            (&local_18,local_28,
             (void *)((long)&(msg->base_dont_copy_me__upb_internal_use_only).field_0 +
                     ((ulong)local_18._0_8_ >> 0x20 & 0xffff)));
  return (bool)local_28[0];
}

Assistant:

UPB_INLINE bool protobuf_test_messages_proto2_TestAllTypesProto2_optional_bool(const protobuf_test_messages_proto2_TestAllTypesProto2* msg) {
  bool default_val = false;
  bool ret;
  const upb_MiniTableField field = {13, 16, 76, kUpb_NoSub, 8, (int)kUpb_FieldMode_Scalar | ((int)kUpb_FieldRep_1Byte << kUpb_FieldRep_Shift)};
  _upb_Message_GetNonExtensionField(UPB_UPCAST(msg), &field,
                                    &default_val, &ret);
  return ret;
}